

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::SyncToLiteralAndBackupInstT<UnifiedRegex::Char2LiteralScannerMixin>::Exec
          (SyncToLiteralAndBackupInstT<UnifiedRegex::Char2LiteralScannerMixin> *this,
          Matcher *matcher,Char *input,CharCount inputLength,CharCount *matchStart,
          CharCount *inputOffset,CharCount *nextSyncInputOffset,uint8 **instPointer,
          ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  CharCount CVar1;
  bool bVar2;
  uint *puVar3;
  CharCountOrFlag local_4c;
  uint local_48;
  undefined1 local_41;
  CharCount maxBackup;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  Char *pCStack_28;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  SyncToLiteralAndBackupInstT<UnifiedRegex::Char2LiteralScannerMixin> *this_local;
  
  local_41 = firstIteration;
  _maxBackup = inputOffset;
  inputOffset_local = matchStart;
  matchStart_local._4_4_ = inputLength;
  pCStack_28 = input;
  input_local = (Char *)matcher;
  matcher_local = (Matcher *)this;
  if (inputLength - *matchStart < (this->super_BackupMixin).backup.lower) {
    this_local._7_1_ =
         Matcher::HardFail(matcher,input,inputLength,matchStart,inputOffset,instPointer,contStack,
                           assertionStack,qcTicks,ImmediateFail);
  }
  else if (*inputOffset < *nextSyncInputOffset) {
    *instPointer = *instPointer + 0xd;
    this_local._7_1_ = false;
  }
  else {
    if (*inputOffset - *matchStart < (this->super_BackupMixin).backup.lower) {
      *inputOffset = *matchStart + (this->super_BackupMixin).backup.lower;
    }
    bVar2 = Char2LiteralScannerMixin::Match
                      (&this->super_Char2LiteralScannerMixin,matcher,input,inputLength,inputOffset);
    if (bVar2) {
      *nextSyncInputOffset = *_maxBackup + 1;
      if ((this->super_BackupMixin).backup.upper != 0xffffffff) {
        local_48 = *_maxBackup - *inputOffset_local;
        CVar1 = *_maxBackup;
        local_4c = (this->super_BackupMixin).backup.upper;
        puVar3 = min<unsigned_int>(&local_48,&local_4c);
        *inputOffset_local = CVar1 - *puVar3;
      }
      *_maxBackup = *inputOffset_local;
      *instPointer = *instPointer + 0xd;
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ =
           Matcher::HardFail((Matcher *)input_local,pCStack_28,matchStart_local._4_4_,
                             inputOffset_local,_maxBackup,instPointer,contStack,assertionStack,
                             qcTicks,ImmediateFail);
    }
  }
  return this_local._7_1_;
}

Assistant:

inline bool SyncToLiteralAndBackupInstT<ScannerT>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (backup.lower > inputLength - matchStart)
        {
            // Even match at very end doesn't allow for minimum backup
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        if(inputOffset < nextSyncInputOffset)
        {
            // We have not yet reached the offset in the input we last synced to before backing up, so it's unnecessary to sync
            // again since we'll sync to the same point in the input and back up to the same place we are at now
            instPointer += sizeof(*this);
            return false;
        }

        if (backup.lower > inputOffset - matchStart)
        {
            // No use looking for match until minimum backup is possible
            inputOffset = matchStart + backup.lower;
        }

        if (!this->Match(matcher, input, inputLength, inputOffset))
        {
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        nextSyncInputOffset = inputOffset + 1;

        if (backup.upper != CharCountFlag)
        {
            // Set new start at most backup.upper from start of literal
            CharCount maxBackup = inputOffset - matchStart;
            matchStart = inputOffset - min(maxBackup, (CharCount)backup.upper);
        }
        // else: leave start where it is

        // Move input to new match start
        inputOffset = matchStart;

        instPointer += sizeof(*this);
        return false;
    }